

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O3

bool clusterG2(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  undefined8 uVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer psVar7;
  undefined1 (*pauVar8) [16];
  undefined1 auVar9 [16];
  TKeyPressCollection *pTVar10;
  uint uVar11;
  TClusterId *ck;
  undefined1 (*pauVar12) [16];
  TClusterId *pTVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  undefined1 (*pauVar17) [16];
  uint uVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  undefined8 *puVar26;
  bool bVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vector<double,_std::allocator<double>_> nsum;
  undefined1 (*local_b0) [16];
  allocator_type local_a1;
  ulong local_a0;
  ulong local_98;
  TKeyPressCollection *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  TSimilarityMap *local_68;
  long local_60;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> local_50;
  value_type_conflict2 local_38;
  
  auVar9 = _DAT_00115030;
  psVar7 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar19 = ((long)(keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4) *
           -0x5555555555555555;
  uVar18 = (uint)uVar19;
  if ((int)uVar18 < 1) {
    uVar11 = 0;
  }
  else {
    uVar14 = (ulong)(uVar18 + 1 & 0xfffffffe);
    lVar16 = (ulong)(uVar18 & 0x7fffffff) - 1;
    auVar29._8_4_ = (int)lVar16;
    auVar29._0_8_ = lVar16;
    auVar29._12_4_ = (int)((ulong)lVar16 >> 0x20);
    pTVar13 = &psVar7[1].cid;
    auVar29 = auVar29 ^ _DAT_00115030;
    auVar30 = _DAT_00115020;
    do {
      auVar31 = auVar30 ^ auVar9;
      lVar16 = auVar30._8_8_;
      if ((bool)(~(auVar31._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar31._0_4_ ||
                  auVar29._4_4_ < auVar31._4_4_) & 1)) {
        pTVar13[-0xc] = (int)(auVar30._0_8_ + 1);
      }
      if ((auVar31._12_4_ != auVar29._12_4_ || auVar31._8_4_ <= auVar29._8_4_) &&
          auVar31._12_4_ <= auVar29._12_4_) {
        *pTVar13 = (TClusterId)(lVar16 + 1);
      }
      auVar30._0_8_ = auVar30._0_8_ + 2;
      auVar30._8_8_ = lVar16 + 2;
      pTVar13 = pTVar13 + 0x18;
      uVar14 = uVar14 - 2;
      uVar11 = uVar18;
    } while (uVar14 != 0);
  }
  local_38 = 1.0;
  local_90 = keyPresses;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,(long)((uVar19 << 0x20) + 0x100000000) >> 0x20,&local_38,&local_a1);
  local_98 = uVar19;
  if ((int)uVar18 < 2) {
    local_b0 = (undefined1 (*) [16])0x0;
    pauVar20 = (undefined1 (*) [16])0x0;
    pauVar24 = (undefined1 (*) [16])0x0;
  }
  else {
    local_88 = (ulong)(uVar18 - 1);
    uVar19 = (ulong)(uVar18 & 0x7fffffff);
    uVar14 = 1;
    local_80 = 0;
    local_b0 = (undefined1 (*) [16])0x0;
    pauVar20 = (undefined1 (*) [16])0x0;
    pauVar24 = (undefined1 (*) [16])0x0;
    local_70 = uVar19;
    local_68 = sim;
    do {
      lVar16 = local_80 * 3;
      local_a0 = local_80;
      local_80 = local_80 + 1;
      local_78 = uVar14;
      local_60 = lVar16;
      do {
        uVar1 = *(undefined8 *)
                 (*(long *)((long)&(((sim->
                                     super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                                   super__Vector_impl_data + lVar16 * 8) + uVar14 * 0x10);
        if (pauVar20 == pauVar24) {
          uVar19 = (long)pauVar20 - (long)local_b0;
          if (uVar19 == 0x7ffffffffffffff0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar23 = (long)uVar19 >> 4;
          uVar22 = uVar23;
          if (pauVar20 == local_b0) {
            uVar22 = 1;
          }
          uVar21 = uVar22 + uVar23;
          if (0x7fffffffffffffe < uVar21) {
            uVar21 = 0x7ffffffffffffff;
          }
          if (CARRY8(uVar22,uVar23)) {
            uVar21 = 0x7ffffffffffffff;
          }
          local_58 = uVar1;
          pauVar12 = (undefined1 (*) [16])operator_new(uVar21 * 0x10);
          *(int *)((long)pauVar12 + uVar19) = (int)local_a0;
          *(int *)((long)pauVar12 + uVar19 + 4) = (int)uVar14;
          *(undefined8 *)((long)pauVar12 + uVar19 + 8) = local_58;
          pauVar25 = pauVar12;
          for (pauVar24 = local_b0; pauVar20 != pauVar24; pauVar24 = pauVar24 + 1) {
            uVar1 = *(undefined8 *)(*pauVar24 + 8);
            *(undefined8 *)*pauVar25 = *(undefined8 *)*pauVar24;
            *(undefined8 *)(*pauVar25 + 8) = uVar1;
            pauVar25 = pauVar25 + 1;
          }
          if (local_b0 != (undefined1 (*) [16])0x0) {
            operator_delete(local_b0,uVar19);
          }
          pauVar24 = pauVar12 + uVar21;
          uVar19 = local_70;
          lVar16 = local_60;
          sim = local_68;
          local_b0 = pauVar12;
        }
        else {
          *(int *)*pauVar20 = (int)local_a0;
          *(int *)(*pauVar20 + 4) = (int)uVar14;
          *(undefined8 *)(*pauVar20 + 8) = uVar1;
          pauVar25 = pauVar20;
        }
        pauVar20 = pauVar25 + 1;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar19);
      uVar14 = local_78 + 1;
    } while (local_80 != local_88);
    if (local_b0 != pauVar20) {
      uVar19 = (long)pauVar20 - (long)local_b0 >> 4;
      lVar16 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_b0,pauVar20,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pauVar20 - (long)local_b0 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_b0,pauVar20);
      }
      else {
        pauVar12 = local_b0 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG2(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_b0,pauVar12);
        if (pauVar12 != pauVar20) {
          do {
            uVar1 = *(undefined8 *)*pauVar12;
            dVar2 = *(double *)(*pauVar12 + 8);
            pauVar15 = pauVar12;
            pauVar17 = pauVar12;
            if (*(double *)(pauVar12[-1] + 8) <= dVar2 && dVar2 != *(double *)(pauVar12[-1] + 8)) {
              do {
                pauVar15 = pauVar17 + -1;
                *pauVar17 = pauVar17[-1];
                pauVar8 = pauVar17 + -2;
                pauVar17 = pauVar15;
              } while (*(double *)(*pauVar8 + 8) <= dVar2 && dVar2 != *(double *)(*pauVar8 + 8));
            }
            *(undefined8 *)*pauVar15 = uVar1;
            *(double *)(*pauVar15 + 8) = dVar2;
            bVar27 = pauVar12 != pauVar25;
            pauVar12 = pauVar12 + 1;
          } while (bVar27);
        }
      }
    }
  }
  puts("[+] Top 10 pairs");
  puVar26 = (undefined8 *)(*local_b0 + 8);
  uVar19 = 0;
  do {
    printf("    Pair %d: %d %d %g\n",*puVar26,uVar19 & 0xffffffff,(ulong)*(uint *)(puVar26 + -1),
           (ulong)*(uint *)((long)puVar26 + -4));
    pTVar10 = local_90;
    uVar19 = uVar19 + 1;
    puVar26 = puVar26 + 2;
  } while (uVar19 != 10);
  uVar19 = (ulong)((long)pauVar20 - (long)local_b0) >> 4;
  if (0 < (int)uVar19) {
    local_a0 = local_98 & 0x7fffffff;
    uVar22 = 0;
    uVar14 = local_98;
    do {
      fVar28 = frand();
      pauVar20 = local_b0 + uVar22;
      if ((double)fVar28 <= *(double *)(*pauVar20 + 8)) {
        if (*(double *)(*pauVar20 + 8) < 0.5) goto LAB_0010c764;
        iVar3 = *(int *)*pauVar20;
        psVar7 = (pTVar10->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar4 = *(int *)(*pauVar20 + 4);
        iVar5 = psVar7[iVar3].cid;
        iVar6 = psVar7[iVar4].cid;
        if (iVar5 != iVar6) {
          if (iVar6 < iVar5) {
            iVar5 = iVar6;
          }
          if ((int)uVar14 < 1) {
            printf("Clusters %3d %5.4f:",(ulong)(uVar11 - 1));
          }
          else {
            pTVar13 = &psVar7->cid;
            uVar23 = local_a0;
            do {
              if ((*pTVar13 == psVar7[iVar3].cid) || (*pTVar13 == psVar7[iVar4].cid)) {
                *pTVar13 = iVar5;
              }
              pTVar13 = pTVar13 + 0xc;
              uVar23 = uVar23 - 1;
            } while (uVar23 != 0);
            printf("Clusters %3d %5.4f:",(ulong)(uVar11 - 1));
            if (0 < (int)uVar14) {
              lVar16 = 0x20;
              uVar23 = local_a0;
              do {
                printf(" %3d",(ulong)*(uint *)((long)&(((pTVar10->
                                                                                                                
                                                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ).
                                                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  waveform).samples + lVar16));
                lVar16 = lVar16 + 0x30;
                uVar23 = uVar23 - 1;
                uVar14 = local_98;
              } while (uVar23 != 0);
            }
          }
          uVar11 = uVar11 - 1;
          putchar(10);
          if (uVar11 == 0x38) break;
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != (uVar19 & 0x7fffffff));
    if (local_b0 == (undefined1 (*) [16])0x0) goto LAB_0010c774;
  }
LAB_0010c764:
  operator_delete(local_b0,(long)pauVar24 - (long)local_b0);
LAB_0010c774:
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool clusterG2(TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<double> nsum(n + 1, 1.0);
    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto & ci = keyPresses[curpair.i].cid;
        auto & cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");

        if (nclusters == 56) break;
    }

    return true;
}